

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_sei.c
# Opt level: O1

MPP_RET h264e_sei_recovery_point_to_packet(MppPacket packet,RK_S32 *len,RK_U32 recovery_frame_cnt)

{
  RK_S32 RVar1;
  uint len_00;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  MppWriteCtx bit_ctx;
  RK_U8 src [100];
  MppWriteCtx local_c8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  pvVar2 = mpp_packet_get_pos(packet);
  pvVar3 = mpp_packet_get_data(packet);
  sVar4 = mpp_packet_get_size(packet);
  sVar5 = mpp_packet_get_length(packet);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_38 = 0;
  mpp_writer_init(&local_c8,&local_98,100);
  write_recovery_point(&local_c8,recovery_frame_cnt);
  RVar1 = mpp_writer_bytes(&local_c8);
  mpp_writer_init(&local_c8,(void *)((long)pvVar2 + sVar5),
                  ((int)sVar4 + (int)pvVar3) - (int)(void *)((long)pvVar2 + sVar5));
  iVar6 = 0;
  mpp_writer_put_raw_bits(&local_c8,0,0x18);
  mpp_writer_put_raw_bits(&local_c8,1,8);
  mpp_writer_put_raw_bits(&local_c8,0,1);
  mpp_writer_put_raw_bits(&local_c8,0,2);
  mpp_writer_put_raw_bits(&local_c8,6,5);
  mpp_writer_put_bits(&local_c8,6,8);
  if (0xfe < RVar1) {
    iVar6 = 0;
    do {
      mpp_writer_put_bits(&local_c8,0xff,8);
      iVar6 = iVar6 + 0xff;
    } while (iVar6 <= RVar1 + -0xff);
  }
  mpp_writer_put_bits(&local_c8,RVar1 - iVar6,8);
  write_recovery_point(&local_c8,recovery_frame_cnt);
  len_00 = mpp_writer_bytes(&local_c8);
  if (len != (RK_S32 *)0x0) {
    *len = len_00;
  }
  mpp_packet_set_length(packet,sVar5 + (long)(int)len_00);
  mpp_packet_add_segment_info(packet,6,(RK_S32)sVar5,len_00);
  if (((byte)h264e_debug & 0x80) != 0) {
    _mpp_log_l(4,"h264e_sei","sei data length %d pkt len %d -> %d\n",
               "h264e_sei_recovery_point_to_packet",(ulong)len_00,sVar5,sVar5 + (long)(int)len_00);
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_sei_recovery_point_to_packet(MppPacket packet, RK_S32 *len, RK_U32 recovery_frame_cnt)
{
    MPP_RET ret = MPP_OK;
    void *pos = mpp_packet_get_pos(packet);
    void *pkt_base = mpp_packet_get_data(packet);
    size_t pkt_size = mpp_packet_get_size(packet);
    size_t length = mpp_packet_get_length(packet);
    void *dst = pos + length;
    RK_S32 buf_size = (pkt_base + pkt_size) - (pos + length);
    MppWriteCtx bit_ctx;
    MppWriteCtx *bit = &bit_ctx;
    RK_S32 payload_size = 0;
    RK_S32 type = H264_SEI_RECOVERY_POINT;
    RK_U8 src[100] = {0};
    RK_S32 sei_size = 0;
    RK_S32 i;
    mpp_writer_init(bit, src, 100);
    write_recovery_point(bit, recovery_frame_cnt);
    payload_size = mpp_writer_bytes(bit);

    mpp_writer_init(bit, dst, buf_size);

    /* start_code_prefix 00 00 00 01 */
    mpp_writer_put_raw_bits(bit, 0, 24);
    mpp_writer_put_raw_bits(bit, 1, 8);
    /* forbidden_zero_bit */
    mpp_writer_put_raw_bits(bit, 0, 1);
    /* nal_ref_idc */
    mpp_writer_put_raw_bits(bit, H264_NALU_PRIORITY_DISPOSABLE, 2);
    /* nal_unit_type */
    mpp_writer_put_raw_bits(bit, H264_NALU_TYPE_SEI, 5);

    /* sei_payload_type_ff_byte */
    for (i = 0; i <= type - 255; i += 255)
        mpp_writer_put_bits(bit, 0xff, 8);

    /* sei_last_payload_type_byte */
    mpp_writer_put_bits(bit, type - i, 8);

    /* sei_payload_size_ff_byte */
    for (i = 0; i <= payload_size - 255; i += 255)
        mpp_writer_put_bits(bit, 0xff, 8);

    /* sei_last_payload_size_byte */
    mpp_writer_put_bits(bit, payload_size - i, 8);

    write_recovery_point(bit, recovery_frame_cnt);

    sei_size = mpp_writer_bytes(bit);
    if (len)
        *len = sei_size;

    mpp_packet_set_length(packet, length + sei_size);
    mpp_packet_add_segment_info(packet, H264_NALU_TYPE_SEI, length, sei_size);

    h264e_dbg_sei("sei data length %d pkt len %d -> %d\n", sei_size,
                  length, length + sei_size);

    return ret;

}